

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

vec<4,_float,_(glm::qualifier)0> __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::
getData_helper<glm::vec<4,float,(glm::qualifier)0>>(GLAttributeBuffer *this,size_t ind)

{
  ulong uVar1;
  allocator local_29;
  string local_28;
  
  if (((this->super_AttributeBuffer).setFlag != true) ||
     (uVar1 = (long)(this->super_AttributeBuffer).arrayCount *
              (this->super_AttributeBuffer).dataSize, uVar1 < ind || uVar1 - ind == 0)) {
    std::__cxx11::string::string((string *)&local_28,"bad getData",&local_29);
    exception(&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return (vec<4,_float,_(glm::qualifier)0>)ZEXT816(0);
}

Assistant:

T GLAttributeBuffer::getData_helper(size_t ind) {
  if (!isSet() || ind >= static_cast<size_t>(getDataSize() * getArrayCount())) exception("bad getData");
  bind();
  T readValue{};
  return readValue;
}